

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O0

bool __thiscall QDockWidgetLayout::nativeWindowDeco(QDockWidgetLayout *this)

{
  byte bVar1;
  bool bVar2;
  QDockWidgetGroupWindow *pQVar3;
  QDockAreaLayoutInfo *pQVar4;
  QDockWidgetLayout *in_RDI;
  QDockWidgetGroupWindow *in_stack_00000008;
  QDockWidgetGroupWindow *groupWindow;
  bool floating;
  undefined1 in_stack_ffffffffffffffdf;
  undefined7 in_stack_fffffffffffffff0;
  undefined1 in_stack_fffffffffffffff7;
  
  QLayout::parentWidget((QLayout *)CONCAT17(in_stack_fffffffffffffff7,in_stack_fffffffffffffff0));
  bVar1 = QWidget::isWindow((QWidget *)in_RDI);
  QLayout::parentWidget((QLayout *)CONCAT17(bVar1,in_stack_fffffffffffffff0));
  QWidget::parentWidget((QWidget *)0x58a51c);
  pQVar3 = qobject_cast<QDockWidgetGroupWindow_const*>((QObject *)0x58a524);
  if ((pQVar3 != (QDockWidgetGroupWindow *)0x0) &&
     (in_stack_ffffffffffffffdf = true, (bVar1 & 1) == 0)) {
    pQVar4 = QDockWidgetGroupWindow::tabLayoutInfo(in_stack_00000008);
    in_stack_ffffffffffffffdf = pQVar4 != (QDockAreaLayoutInfo *)0x0;
  }
  bVar2 = nativeWindowDeco(in_RDI,(bool)in_stack_ffffffffffffffdf);
  return bVar2;
}

Assistant:

bool QDockWidgetLayout::nativeWindowDeco() const
{
    bool floating = parentWidget()->isWindow();
#if QT_CONFIG(tabbar)
    if (auto groupWindow =
            qobject_cast<const QDockWidgetGroupWindow *>(parentWidget()->parentWidget()))
        floating = floating || groupWindow->tabLayoutInfo();
#endif
    return nativeWindowDeco(floating);
}